

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::ifStmt(Parser *this)

{
  Report *this_00;
  bool bVar1;
  int iVar2;
  LiteralType args;
  SourceLocation *pSVar3;
  pointer pEVar4;
  FilePos *pFVar5;
  Parser *in_RSI;
  unique_ptr<flow::lang::CondStmt,_std::default_delete<flow::lang::CondStmt>_> local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> elseStmt;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> thenStmt;
  string local_b8;
  undefined1 local_94 [18];
  undefined1 local_82 [16];
  undefined1 local_72 [10];
  undefined1 local_68 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> cond;
  undefined1 local_50 [8];
  SourceLocation sloc;
  Parser *this_local;
  
  pSVar3 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar3);
  consume(in_RSI,If);
  expr((Parser *)local_68);
  consumeIf(in_RSI,Then);
  pEVar4 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                     ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                      local_68);
  iVar2 = (*(pEVar4->super_ASTNode)._vptr_ASTNode[3])();
  if (iVar2 != 1) {
    if (iVar2 != 3) {
      this_00 = in_RSI->report_;
      pSVar3 = lastLocation(in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"If expression must be boolean type. Received type {} instead."
                 ,(allocator<char> *)
                  ((long)&thenStmt._M_t.
                          super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                          .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl + 7));
      pEVar4 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::operator->
                         ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                          local_68);
      args = (*(pEVar4->super_ASTNode)._vptr_ASTNode[3])();
      diagnostics::Report::typeError<flow::LiteralType>(this_00,pSVar3,&local_b8,args);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&thenStmt._M_t.
                         super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                         .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl + 7));
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
      thenStmt._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
      _M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
      super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._0_4_ = 1;
      goto LAB_0015b386;
    }
    local_72._0_2_ = 0x37;
    pFVar5 = end(in_RSI);
    SourceLocation::update((SourceLocation *)local_50,pFVar5);
    std::
    make_unique<flow::lang::UnaryExpr,flow::Opcode,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
              ((Opcode *)(local_72 + 2),
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_72,
               (SourceLocation *)local_68);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_68,
               (unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> *)
               (local_72 + 2));
    std::unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_>::~unique_ptr
              ((unique_ptr<flow::lang::UnaryExpr,_std::default_delete<flow::lang::UnaryExpr>_> *)
               (local_72 + 2));
    local_82._0_2_ = 0x22;
    local_94._0_4_ = 0;
    std::make_unique<flow::lang::LiteralExpr<long_long>,int,flow::SourceLocation&>
              ((int *)(local_94 + 4),(SourceLocation *)local_94);
    std::
    make_unique<flow::lang::BinaryExpr,flow::Opcode,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::LiteralExpr<long_long>,std::default_delete<flow::lang::LiteralExpr<long_long>>>>
              ((Opcode *)(local_82 + 2),
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_82,
               (unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
                *)local_68);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_68,
               (unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_> *)
               (local_82 + 2));
    std::unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_>::
    ~unique_ptr((unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_> *)
                (local_82 + 2));
    std::
    unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
    ::~unique_ptr((unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
                   *)(local_94 + 4));
  }
  stmt((Parser *)&elseStmt);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&elseStmt);
  if (bVar1) {
    std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
    unique_ptr<std::default_delete<flow::lang::Stmt>,void>
              ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)local_d0);
    bVar1 = consumeIf(in_RSI,Else);
    if (bVar1) {
      stmt((Parser *)local_d8);
      std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::operator=
                ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_d0,
                 (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_d8);
      std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
                ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_d8);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_d0);
      if (bVar1) goto LAB_0015b2f0;
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
    }
    else {
LAB_0015b2f0:
      pFVar5 = end(in_RSI);
      SourceLocation::update((SourceLocation *)local_50,pFVar5);
      std::
      make_unique<flow::lang::CondStmt,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,flow::SourceLocation&>
                ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_e0,
                 (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_68,
                 &elseStmt,(SourceLocation *)local_d0);
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<flow::lang::CondStmt,std::default_delete<flow::lang::CondStmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 &local_e0);
      std::unique_ptr<flow::lang::CondStmt,_std::default_delete<flow::lang::CondStmt>_>::~unique_ptr
                (&local_e0);
    }
    thenStmt._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
    _M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._0_4_ = 1;
    std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
              ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_d0);
  }
  else {
    std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
    unique_ptr<std::default_delete<flow::lang::Stmt>,void>
              ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
               (nullptr_t)0x0);
    thenStmt._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
    _M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr(&elseStmt);
LAB_0015b386:
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_68);
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::ifStmt() {
  // ifStmt ::= 'if' expr ['then'] stmt ['else' stmt]
  SourceLocation sloc(location());

  consume(Token::If);
  std::unique_ptr<Expr> cond(expr());
  consumeIf(Token::Then);

  switch (cond->getType()) {
    case LiteralType::Boolean:
      break;
    case LiteralType::String:
      cond = std::make_unique<UnaryExpr>(Opcode::SLEN, std::move(cond), sloc.update(end()));
      cond = std::make_unique<BinaryExpr>(Opcode::NCMPNE, std::move(cond),
          std::make_unique<NumberExpr>(0, sloc));
      break;
    default:
      report_.typeError(
          lastLocation(),
          "If expression must be boolean type. Received type {} instead.",
          cond->getType());
      return nullptr;
  }

  std::unique_ptr<Stmt> thenStmt(stmt());
  if (!thenStmt) return nullptr;

  std::unique_ptr<Stmt> elseStmt;

  if (consumeIf(Token::Else)) {
    elseStmt = stmt();
    if (!elseStmt) {
      return nullptr;
    }
  }

  return std::make_unique<CondStmt>(std::move(cond), std::move(thenStmt),
                                    std::move(elseStmt), sloc.update(end()));
}